

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution1d.cpp
# Opt level: O0

float __thiscall embree::Distribution1D::sample(Distribution1D *this,float u)

{
  float *pfVar1;
  float *pfVar2;
  const_reference pvVar3;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  undefined1 auVar5 [16];
  float fraction;
  float dCDF;
  int index;
  float *pointer;
  __m128 r;
  __m128 a;
  int local_170;
  int local_16c;
  float *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int local_148 [3];
  int local_13c;
  float *local_138;
  float local_12c;
  float local_11c;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  float local_48;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_12c = in_XMM0_Da;
  std::vector<float,_std::allocator<float>_>::data
            ((vector<float,_std::allocator<float>_> *)0x127ea5);
  std::vector<float,_std::allocator<float>_>::data
            ((vector<float,_std::allocator<float>_> *)0x127eb8);
  pfVar1 = std::upper_bound<float_const*,float>
                     ((float *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_RDI,
                      in_stack_fffffffffffffea0);
  local_138 = pfVar1;
  pfVar2 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x127ef6);
  local_148[2] = (int)((long)pfVar1 - (long)pfVar2 >> 2) + -1;
  local_148[1] = 0;
  local_148[0] = (int)*(undefined8 *)in_RDI + -1;
  local_e0 = local_148 + 2;
  local_e8 = local_148 + 1;
  local_f0 = local_148;
  local_16c = local_148[0];
  if (local_148[2] < local_148[0]) {
    local_16c = local_148[2];
  }
  local_10 = 0;
  local_c = local_16c;
  local_170 = local_10;
  if (-1 < local_16c) {
    local_170 = local_16c;
  }
  local_13c = local_170;
  local_8 = local_148[0];
  local_4 = local_148[2];
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 8),(long)(local_170 + 1));
  fVar4 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 8),(long)local_13c);
  fVar4 = fVar4 - *pvVar3;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 8),(long)local_13c);
    auVar5 = rcpss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    local_48 = auVar5._0_4_;
    local_11c = (float)local_13c + (local_12c - *pvVar3) * local_48 * (2.0 - local_48 * fVar4);
  }
  else {
    local_11c = (float)local_13c;
  }
  return local_11c;
}

Assistant:

float Distribution1D::sample(const float u) const
  {
    /*! coarse sampling of the distribution */
    const float* pointer = std::upper_bound(CDF.data(), CDF.data()+size, u);
    int index = clamp(int(pointer-CDF.data()-1),0,int(size)-1);

    /*! refine sampling linearly by assuming the distribution being a step function */
    const float dCDF = CDF[index+1] - CDF[index];
    if (dCDF == 0.0f) return float(index);
    float fraction = (u - CDF[index]) * rcp(dCDF);
    return float(index)+fraction;
  }